

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O1

int __thiscall IPAsirMiniSAT::solve(IPAsirMiniSAT *this,bool simp)

{
  lbool lVar1;
  int iVar2;
  int iVar3;
  
  this->calls = this->calls + 1;
  if (this->fmap != (uchar *)0x0) {
    operator_delete__(this->fmap);
    this->fmap = (uchar *)0x0;
    this->szfmap = 0;
  }
  Minisat::vec<Minisat::Lit>::copyTo
            (&this->assumptions,&(this->super_SimpSolver).super_Solver.assumptions);
  lVar1 = Minisat::SimpSolver::solve_(&this->super_SimpSolver,simp,false);
  if ((this->assumptions).data != (Lit *)0x0) {
    (this->assumptions).sz = 0;
  }
  this->nomodel = lVar1.value != '\0';
  iVar2 = 10;
  if (lVar1.value != '\0') {
    iVar2 = 0x14;
  }
  iVar3 = 0;
  if ((lVar1.value & 2) == 0) {
    iVar3 = iVar2;
  }
  return iVar3;
}

Assistant:

int solve(bool simp = false)
    {
        calls++;
        reset();
        lbool res = solveLimited(assumptions, simp);
        assumptions.clear();
        nomodel = (res != l_True);
        return (res == l_Undef) ? 0 : (res == l_True ? 10 : 20);
    }